

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::GetPerJPRatio
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,size_t s)

{
  undefined1 auVar1 [16];
  LIndex LVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  
  LVar2 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)(this->_m_bgip).px);
  auVar4 = Globals::CastLIndexToDouble(LVar2);
  auVar3._0_8_ = auVar4._8_8_;
  auVar3._8_56_ = extraout_var;
  auVar1 = vcvtusi2sd_avx512f(auVar3._0_16_,s);
  return auVar1._0_8_ / auVar4._0_8_;
}

Assistant:

double GetPerJPRatio(size_t s) const
    {
        double nrJPols=0;
        try{
            nrJPols = CastLIndexToDouble(
                _m_bgip->GetNrJointPolicies()
                );
        } catch(E& e)
        { 
            nrJPols = std::numeric_limits<double>::max();
        }
        return (double)s / nrJPols;
    }